

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O3

int bmcg_sat_solver_add_and
              (bmcg_sat_solver *s,int iVar,int iVar0,int iVar1,int fCompl0,int fCompl1,int fCompl)

{
  int iVar2;
  int iVar3;
  undefined4 in_register_0000008c;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint local_44;
  uint local_40;
  uint local_3c;
  undefined8 local_38;
  
  if (-1 < iVar) {
    local_38 = CONCAT44(in_register_0000008c,fCompl1);
    uVar5 = (uint)(fCompl == 0) + iVar * 2;
    local_44 = uVar5;
    if ((-1 < iVar0) && ((uint)fCompl0 < 2)) {
      uVar4 = fCompl0 + iVar0 * 2;
      local_40 = uVar4;
      iVar2 = glucose_solver_addclause((SimpSolver *)s,(int *)&local_44,2);
      iVar3 = 0;
      if (iVar2 != 0) {
        local_44 = uVar5;
        if ((iVar1 < 0) || (1 < (uint)local_38)) goto LAB_005c12ac;
        uVar6 = (uint)local_38 + iVar1 * 2;
        local_40 = uVar6;
        iVar2 = glucose_solver_addclause((SimpSolver *)s,(int *)&local_44,2);
        iVar3 = 0;
        if (iVar2 != 0) {
          if (1 < (uint)fCompl) goto LAB_005c12ac;
          local_44 = iVar * 2 | fCompl;
          local_40 = uVar4 ^ 1;
          local_3c = uVar6 ^ 1;
          iVar3 = glucose_solver_addclause((SimpSolver *)s,(int *)&local_44,3);
        }
      }
      return iVar3;
    }
  }
LAB_005c12ac:
  __assert_fail("Var >= 0 && !(c >> 1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x12e,"int Abc_Var2Lit(int, int)");
}

Assistant:

int bmcg_sat_solver_add_and( bmcg_sat_solver * s, int iVar, int iVar0, int iVar1, int fCompl0, int fCompl1, int fCompl )
{
    int Lits[3];

    Lits[0] = Abc_Var2Lit( iVar, !fCompl );
    Lits[1] = Abc_Var2Lit( iVar0, fCompl0 );
    if ( !bmcg_sat_solver_addclause( s, Lits, 2 ) )
        return 0;

    Lits[0] = Abc_Var2Lit( iVar, !fCompl );
    Lits[1] = Abc_Var2Lit( iVar1, fCompl1 );
    if ( !bmcg_sat_solver_addclause( s, Lits, 2 ) )
        return 0;

    Lits[0] = Abc_Var2Lit( iVar,   fCompl );
    Lits[1] = Abc_Var2Lit( iVar0, !fCompl0 );
    Lits[2] = Abc_Var2Lit( iVar1, !fCompl1 );
    if ( !bmcg_sat_solver_addclause( s, Lits, 3 ) )
        return 0;

    return 1;
}